

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_wfi_arm(CPUARMState *env,uint32_t insn_len)

{
  CPUState *cpu;
  ulong uVar1;
  code *pcVar2;
  char cVar3;
  uint uVar4;
  uint64_t uVar5;
  uint target_el;
  
  uVar4 = arm_current_el(env);
  uVar1 = env->features;
  target_el = 0;
  if (((uint)uVar1 >> 9 & 1) != 0) goto LAB_00542253;
  if (uVar4 == 1) {
LAB_0054222a:
    uVar5 = arm_hcr_el2_eff_arm(env);
    if (((uint)uVar5 >> 0xd & 1) != 0) {
      target_el = 2;
      goto LAB_00542253;
    }
LAB_00542241:
    if (((env->cp15).scr_el3 & 0x1000) != 0) {
      target_el = 3;
      goto LAB_00542253;
    }
  }
  else {
    if (uVar4 == 0) {
      if (((uint)uVar1 >> 0x1b & 1) != 0) {
        if (((uVar1 >> 0x21 & 1) == 0) ||
           ((uVar1 & 0x10000000) != 0 || ((env->cp15).scr_el3 & 1) != 0)) {
          target_el = 1;
        }
        else {
          target_el = 3;
        }
        if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)target_el * 8 + -0x26) & 1) == 0)
        goto LAB_00542253;
      }
      goto LAB_0054222a;
    }
    if (uVar4 < 3) goto LAB_00542241;
  }
  target_el = 0;
LAB_00542253:
  pcVar2 = *(code **)(env[-2].xregs[0x1c] + 8);
  if (pcVar2 == (code *)0x0) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
               ,0x1bc,"cc->has_work");
  }
  cpu = (CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b);
  cVar3 = (*pcVar2)(cpu);
  if (cVar3 == '\0') {
    if (target_el != 0) {
      if (env->aarch64 == 0) {
        env->regs[0xf] = env->regs[0xf] - insn_len;
      }
      else {
        env->pc = env->pc - (ulong)insn_len;
      }
      raise_exception_arm(env,1,(uint)(insn_len != 2) << 0x19 | 0x5e00000,target_el);
    }
    *(undefined4 *)(env[-2].xregs + 0x1a) = 0x10001;
    *(undefined4 *)(env[-2].xregs + 0x19) = 1;
    cpu_loop_exit_arm(cpu);
  }
  return;
}

Assistant:

void HELPER(wfi)(CPUARMState *env, uint32_t insn_len)
{
    CPUState *cs = env_cpu(env);
    int target_el = check_wfx_trap(env, false);

    if (cpu_has_work(cs)) {
        /* Don't bother to go into our "low power state" if
         * we would just wake up immediately.
         */
        return;
    }

    if (target_el) {
        if (env->aarch64) {
            env->pc -= insn_len;
        } else {
            env->regs[15] -= insn_len;
        }

        raise_exception(env, EXCP_UDEF, syn_wfx(1, 0xe, 0, insn_len == 2),
                        target_el);
    }

    cs->exception_index = EXCP_HLT;
    cs->halted = 1;
    cpu_loop_exit(cs);
}